

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O0

void param_help(void)

{
  undefined1 local_2db8 [8];
  char param_comments [73] [128];
  char param_names [73] [32];
  int local_c;
  int i;
  
  memcpy(param_comments[0x48] + 0x78,"VERSION",0x920);
  memcpy(local_2db8,"Parameter file version",0x2480);
  fprintf(_stderr,"INFO: Comments of parameters (parameter version %.1f)\n\n",0x4010000000000000);
  for (local_c = 0; local_c < 0x49; local_c = local_c + 1) {
    if (param_names[(long)local_c + -1][0x18] != '_') {
      fprintf(_stderr,"  %20s: %s\n",param_names[(long)local_c + -1] + 0x18,
              param_comments[(long)local_c + -1] + 0x78);
    }
  }
  return;
}

Assistant:

void param_help(void)
{
  int i;
  char param_names[YP_PARAM_NUM][32] = YP_PARAM_NAME;
  char param_comments[YP_PARAM_NUM][128] = YP_PARAM_COMMENT;

  fprintf(stderr, "INFO: Comments of parameters (parameter version %.1f)\n\n", YP_PARAM_REQUIRED_VERSION);
  for (i = 0; i < YP_PARAM_NUM; i++)
  {
    if (param_names[i][0] == '_')
      continue;
    fprintf(stderr, "  %20s: %s\n", param_names[i], param_comments[i]);
  }
}